

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_hdwallet.cpp
# Opt level: O0

void __thiscall
cfd::core::KeyData::KeyData
          (KeyData *this,ExtPrivkey *ext_privkey,string *child_path,ByteData *finterprint)

{
  ByteData *string_path;
  ulong uVar1;
  Pubkey local_120;
  Privkey local_108;
  ExtPubkey local_e8;
  allocator local_71;
  string local_70;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_50;
  ByteData *local_28;
  ByteData *finterprint_local;
  string *child_path_local;
  ExtPrivkey *ext_privkey_local;
  KeyData *this_local;
  
  local_28 = finterprint;
  finterprint_local = (ByteData *)child_path;
  child_path_local = (string *)ext_privkey;
  ext_privkey_local = (ExtPrivkey *)this;
  Pubkey::Pubkey(&this->pubkey_);
  Privkey::Privkey(&this->privkey_);
  ExtPrivkey::ExtPrivkey(&this->extprivkey_,(ExtPrivkey *)child_path_local);
  ExtPubkey::ExtPubkey(&this->extpubkey_);
  ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&this->path_);
  ByteData::ByteData(&this->fingerprint_,local_28);
  uVar1 = ::std::__cxx11::string::empty();
  string_path = finterprint_local;
  if ((uVar1 & 1) == 0) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string((string *)&local_70,"KeyData",&local_71);
    ToArrayFromString(&local_50,(string *)string_path,&local_70,'\0');
    ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=(&this->path_,&local_50);
    ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_50);
    ::std::__cxx11::string::~string((string *)&local_70);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_71);
  }
  ExtPrivkey::GetExtPubkey(&local_e8,(ExtPrivkey *)child_path_local);
  ExtPubkey::operator=(&this->extpubkey_,&local_e8);
  ExtPubkey::~ExtPubkey(&local_e8);
  ExtPrivkey::GetPrivkey(&local_108,(ExtPrivkey *)child_path_local);
  Privkey::operator=(&this->privkey_,&local_108);
  Privkey::~Privkey(&local_108);
  Privkey::GetPubkey(&local_120,&this->privkey_);
  Pubkey::operator=(&this->pubkey_,&local_120);
  Pubkey::~Pubkey(&local_120);
  return;
}

Assistant:

KeyData::KeyData(
    const ExtPrivkey& ext_privkey, const std::string& child_path,
    const ByteData& finterprint)
    : extprivkey_(ext_privkey), fingerprint_(finterprint) {
  if (!child_path.empty()) {
    path_ = ToArrayFromString(child_path, "KeyData", 0);
  }
  extpubkey_ = ext_privkey.GetExtPubkey();
  privkey_ = ext_privkey.GetPrivkey();
  pubkey_ = privkey_.GetPubkey();
}